

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::TestPlusArgsFunction::~TestPlusArgsFunction(TestPlusArgsFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~TestPlusArgsFunction((TestPlusArgsFunction *)0x90ed78);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TestPlusArgsFunction(const Builtins& builtins) :
        NonConstantFunction(KnownSystemName::TestPlusArgs, builtins.intType, 1,
                            std::vector<const Type*>{&builtins.stringType}) {}